

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O2

void __thiscall
xmrig::HttpClient::HttpClient
          (HttpClient *this,int method,String *url,IHttpListener *listener,char *data,size_t size)

{
  Dns *this_00;
  allocator local_49;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  HttpContext::HttpContext(&this->super_HttpContext,1,listener);
  (this->super_HttpContext)._vptr_HttpContext = (_func_int **)&PTR__HttpClient_001bb9d0;
  (this->super_IDnsListener)._vptr_IDnsListener = (_func_int **)&PTR__HttpClient_001bba10;
  this->m_quiet = false;
  this->m_port = 0;
  (this->super_HttpContext).super_HttpData.method = method;
  std::__cxx11::string::assign((char *)&(this->super_HttpContext).super_HttpData.url);
  if (data != (char *)0x0) {
    if (size == 0) {
      std::__cxx11::string::string((string *)local_48,data,&local_49);
    }
    else {
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,data,data + size);
    }
    std::__cxx11::string::operator=
              ((string *)&(this->super_HttpContext).super_HttpData.body,(string *)local_48);
    std::__cxx11::string::~string((string *)local_48);
  }
  this_00 = (Dns *)operator_new(0x90);
  Dns::Dns(this_00,&this->super_IDnsListener);
  this->m_dns = this_00;
  return;
}

Assistant:

xmrig::HttpClient::HttpClient(int method, const String &url, IHttpListener *listener, const char *data, size_t size) :
    HttpContext(HTTP_RESPONSE, listener)
{
    this->method = method;
    this->url    = url;

    if (data) {
        body = size ? std::string(data, size) : data;
    }

    m_dns = new Dns(this);
}